

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::EnhancedLayouts::XFBCaptureInactiveOutputVariableTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,XFBCaptureInactiveOutputVariableTest *this,
          GLuint test_case_index)

{
  char *__s;
  size_t sVar1;
  TestError *this_00;
  
  if (test_case_index < 3) {
    __s = *(char **)(&DAT_0210d0a0 + (ulong)test_case_index * 8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar1);
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
             ,0x65b7);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string XFBCaptureInactiveOutputVariableTest::getTestCaseName(glw::GLuint test_case_index)
{
	const GLchar* name = 0;

	switch (test_case_index)
	{
	case TEST_VS:
		name = "vertex";
		break;
	case TEST_TES:
		name = "tesselation evaluation";
		break;
	case TEST_GS:
		name = "geometry";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return name;
}